

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

int32_t __thiscall
icu_63::RegexMatcher::split
          (RegexMatcher *this,UnicodeString *input,UnicodeString *dest,int32_t destCapacity,
          UErrorCode *status)

{
  int32_t iVar1;
  UText **dest_00;
  UText *pUVar2;
  ulong uVar3;
  UText inputText;
  UText local_c0;
  
  memset(&local_c0,0,0x90);
  local_c0.magic = 0x345ad82c;
  local_c0.sizeOfStruct = 0x90;
  utext_openConstUnicodeString_63(&local_c0,input,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    dest_00 = (UText **)uprv_malloc_63((long)destCapacity << 3);
    if (dest_00 != (UText **)0x0) {
      if (0 < destCapacity) {
        uVar3 = 0;
        do {
          pUVar2 = utext_openUnicodeString_63((UText *)0x0,dest,status);
          dest_00[uVar3] = pUVar2;
          uVar3 = uVar3 + 1;
          dest = dest + 1;
        } while ((uint)destCapacity != uVar3);
      }
      iVar1 = split(this,&local_c0,dest_00,destCapacity,status);
      if (0 < destCapacity) {
        uVar3 = 0;
        do {
          utext_close_63(dest_00[uVar3]);
          uVar3 = uVar3 + 1;
        } while ((uint)destCapacity != uVar3);
      }
      uprv_free_63(dest_00);
      utext_close_63(&local_c0);
      return iVar1;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return 0;
}

Assistant:

int32_t  RegexMatcher::split(const UnicodeString &input,
        UnicodeString    dest[],
        int32_t          destCapacity,
        UErrorCode      &status)
{
    UText inputText = UTEXT_INITIALIZER;
    utext_openConstUnicodeString(&inputText, &input, &status);
    if (U_FAILURE(status)) {
        return 0;
    }

    UText **destText = (UText **)uprv_malloc(sizeof(UText*)*destCapacity);
    if (destText == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }
    int32_t i;
    for (i = 0; i < destCapacity; i++) {
        destText[i] = utext_openUnicodeString(NULL, &dest[i], &status);
    }

    int32_t fieldCount = split(&inputText, destText, destCapacity, status);

    for (i = 0; i < destCapacity; i++) {
        utext_close(destText[i]);
    }

    uprv_free(destText);
    utext_close(&inputText);
    return fieldCount;
}